

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols_core.cpp
# Opt level: O1

vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *
cpptrace::detail::resolve_frames
          (vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *frames)

{
  vector<cpptrace::object_frame,_std::allocator<cpptrace::object_frame>_> dlframes;
  vector<cpptrace::object_frame,_std::allocator<cpptrace::object_frame>_> vStack_28;
  
  get_frames_object_info(&vStack_28,frames);
  libdwarf::resolve_frames(__return_storage_ptr__,&vStack_28);
  std::vector<cpptrace::object_frame,_std::allocator<cpptrace::object_frame>_>::~vector(&vStack_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<stacktrace_frame> resolve_frames(const std::vector<frame_ptr>& frames) {
        #if defined(CPPTRACE_GET_SYMBOLS_WITH_LIBDWARF) \
            || defined(CPPTRACE_GET_SYMBOLS_WITH_ADDR2LINE)
         auto dlframes = get_frames_object_info(frames);
        #endif
        #if defined(CPPTRACE_GET_SYMBOLS_WITH_LIBDWARF) && defined(CPPTRACE_GET_SYMBOLS_WITH_DBGHELP)
         std::vector<stacktrace_frame> trace = libdwarf::resolve_frames(dlframes);
         fill_blanks(trace, dbghelp::resolve_frames);
         return trace;
        #else
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_LIBDL
          return libdl::resolve_frames(frames);
         #endif
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_LIBDWARF
          return libdwarf::resolve_frames(dlframes);
         #endif
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_DBGHELP
          return dbghelp::resolve_frames(frames);
         #endif
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_ADDR2LINE
          return addr2line::resolve_frames(dlframes);
         #endif
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_LIBBACKTRACE
          return libbacktrace::resolve_frames(frames);
         #endif
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_NOTHING
          return nothing::resolve_frames(frames);
         #endif
        #endif
    }